

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

int ParseFile_BuildDb(TCascStorage *hs,void *pvListFile)

{
  size_t sVar1;
  TCHAR *pTVar2;
  int local_244;
  undefined1 local_240 [4];
  int nError;
  CASC_CSV Csv;
  QUERY_KEY TagString;
  void *pvListFile_local;
  TCascStorage *hs_local;
  
  Csv.nColumns = 0;
  CASC_CSV::CASC_CSV((CASC_CSV *)local_240);
  sVar1 = CASC_CSV::LoadNextLine((CASC_CSV *)local_240,pvListFile);
  if (sVar1 == 0) {
    hs_local._4_4_ = 1000;
  }
  else {
    hs_local._4_4_ = CASC_CSV::GetData((CASC_CSV *)local_240,&hs->CdnBuildKey,0,true);
    if ((hs_local._4_4_ == 0) &&
       (hs_local._4_4_ = CASC_CSV::GetData((CASC_CSV *)local_240,&hs->CdnConfigKey,1,true),
       hs_local._4_4_ == 0)) {
      local_244 = CASC_CSV::GetData((CASC_CSV *)local_240,(QUERY_KEY *)&Csv.nColumns,2,false);
      if ((local_244 == 0) && (Csv.nColumns != 0)) {
        GetDefaultLocaleMask(hs,(PQUERY_KEY)&Csv.nColumns);
        FreeCascBlob((PQUERY_KEY)&Csv.nColumns);
      }
      pTVar2 = CASC_CSV::GetString((CASC_CSV *)local_240,3);
      hs->szCdnList = pTVar2;
      if (hs->szCdnList == (TCHAR *)0x0) {
        hs_local._4_4_ = 0xc;
      }
      else {
        if (((hs->CdnBuildKey).pbData == (LPBYTE)0x0) || ((hs->CdnConfigKey).pbData == (LPBYTE)0x0))
        {
          local_244 = 1000;
        }
        hs_local._4_4_ = local_244;
      }
    }
  }
  CASC_CSV::~CASC_CSV((CASC_CSV *)local_240);
  return hs_local._4_4_;
}

Assistant:

static int ParseFile_BuildDb(TCascStorage * hs, void * pvListFile)
{
    QUERY_KEY TagString = {NULL, 0};
    CASC_CSV Csv;
    int nError;

    // Load the single line from the text file
    if(Csv.LoadNextLine(pvListFile) == 0)
        return ERROR_BAD_FORMAT;

    // Extract the CDN build key
    nError = Csv.GetData(hs->CdnBuildKey, 0, true);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Load the CDN config key
    nError = Csv.GetData(hs->CdnConfigKey, 1, true);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Load the the tags
    nError = Csv.GetData(TagString, 2, false);
    if (nError == ERROR_SUCCESS && TagString.pbData != NULL)
    {
        GetDefaultLocaleMask(hs, &TagString);
        FreeCascBlob(&TagString);
    }

    // Load the URL
    hs->szCdnList = Csv.GetString(3);
    if (hs->szCdnList == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Verify all variables
    if (hs->CdnBuildKey.pbData == NULL || hs->CdnConfigKey.pbData == NULL)
        nError = ERROR_BAD_FORMAT;
    return nError;
}